

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_pipeline(ConvolutionDepthWise_x86 *this,Option *opt)

{
  ulong uVar1;
  int iVar2;
  Layer *pLVar3;
  float *pfVar4;
  size_type sVar5;
  reference ppLVar6;
  undefined8 in_RSI;
  long *in_RDI;
  Mat weights_1 [3];
  Mat weights [4];
  ParamDict pd_4;
  Layer *op;
  Mat bias_data_g;
  Mat weight_data_g;
  int g;
  int num_output_g;
  int channels_g;
  int i;
  int channels;
  int maxk;
  ParamDict pd_3;
  ParamDict pd_2;
  ParamDict pd_1;
  ParamDict pd;
  Layer *in_stack_ffffffffffffcdf8;
  int in_stack_ffffffffffffce00;
  int in_stack_ffffffffffffce04;
  undefined4 in_stack_ffffffffffffce08;
  int in_stack_ffffffffffffce0c;
  ParamDict *in_stack_ffffffffffffce10;
  size_type in_stack_ffffffffffffce18;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *in_stack_ffffffffffffce20;
  Mat *pMVar7;
  Mat *local_31d8;
  ParamDict *in_stack_ffffffffffffce40;
  Mat *local_31a0;
  Mat *local_3170;
  Mat *local_3138;
  undefined1 local_30e8 [144];
  Mat local_3058 [3];
  Mat local_2f98 [2];
  Mat local_2f08 [4];
  ParamDict local_2e08;
  Layer *local_2508;
  Mat local_24c0 [2];
  int local_2440;
  int local_243c;
  int local_2438;
  int local_2434;
  int local_2430;
  int local_242c;
  undefined1 local_2428 [2304];
  ParamDict local_1b28;
  ParamDict local_1228;
  undefined1 local_918 [2304];
  undefined8 local_18;
  
  local_18 = in_RSI;
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) == 1) {
    pLVar3 = create_layer(in_stack_ffffffffffffce0c);
    in_RDI[1] = (long)pLVar3;
    ParamDict::ParamDict(in_stack_ffffffffffffce40);
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],local_918);
    ParamDict::~ParamDict(in_stack_ffffffffffffce10);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) == 2) {
    pLVar3 = create_layer(in_stack_ffffffffffffce0c);
    in_RDI[1] = (long)pLVar3;
    ParamDict::ParamDict(in_stack_ffffffffffffce40);
    pfVar4 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200),0);
    ParamDict::set(&local_1228,0,*pfVar4);
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],&local_1228);
    ParamDict::~ParamDict(in_stack_ffffffffffffce10);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) == 3) {
    pLVar3 = create_layer(in_stack_ffffffffffffce0c);
    in_RDI[1] = (long)pLVar3;
    ParamDict::ParamDict(in_stack_ffffffffffffce40);
    pfVar4 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200),0);
    ParamDict::set(&local_1b28,0,*pfVar4);
    pfVar4 = Mat::operator[]((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 200),1);
    ParamDict::set(&local_1b28,1,*pfVar4);
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],&local_1b28);
    ParamDict::~ParamDict(in_stack_ffffffffffffce10);
  }
  else if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xc0) == 4) {
    pLVar3 = create_layer(in_stack_ffffffffffffce0c);
    in_RDI[1] = (long)pLVar3;
    ParamDict::ParamDict(in_stack_ffffffffffffce40);
    (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],local_2428);
    ParamDict::~ParamDict(in_stack_ffffffffffffce10);
  }
  if (in_RDI[1] != 0) {
    (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],local_18);
  }
  local_242c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x84) *
               *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x88);
  uVar1 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb4) /
          (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
  local_2430 = ((int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) /
                     (long)local_242c) /
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80) /
               *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8))) *
               *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
  for (local_2434 = 0; iVar2 = local_2434,
      sVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2)),
      iVar2 < (int)sVar5; local_2434 = local_2434 + 1) {
    ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                        ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2),
                         (long)local_2434);
    if (*ppLVar6 != (value_type)0x0) {
      (*(*ppLVar6)->_vptr_Layer[1])();
    }
  }
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::clear
            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)0x1a2ab5);
  if (((((local_2430 != *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8)) ||
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8) !=
         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80))) ||
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x84) != 3)) ||
      ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x88) != 3 ||
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x8c) != 1)))) ||
     ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x90) != 1 ||
      (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) != 1 ||
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98) != 1)) &&
       ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94) != 2 ||
        (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98) != 2)))))))) {
    local_2438 = local_2430 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
    local_243c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x80) /
                 *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
              (in_stack_ffffffffffffce20,in_stack_ffffffffffffce18);
    for (local_2440 = 0; local_2440 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb8);
        local_2440 = local_2440 + 1) {
      Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffce0c,in_stack_ffffffffffffce08),
                 in_stack_ffffffffffffce04,in_stack_ffffffffffffce00);
      Mat::Mat(local_24c0);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb0) != 0) {
        Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffce0c,in_stack_ffffffffffffce08),
                   in_stack_ffffffffffffce04,in_stack_ffffffffffffce00);
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffce0c,in_stack_ffffffffffffce08),
                       (Mat *)CONCAT44(in_stack_ffffffffffffce04,in_stack_ffffffffffffce00));
        Mat::~Mat((Mat *)0x1a2d5a);
      }
      local_2508 = create_layer(in_stack_ffffffffffffce0c);
      ParamDict::ParamDict(in_stack_ffffffffffffce40);
      ParamDict::set(&local_2e08,0,local_243c);
      ParamDict::set(&local_2e08,1,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x84));
      ParamDict::set(&local_2e08,0xb,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x88));
      ParamDict::set(&local_2e08,2,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x8c));
      ParamDict::set(&local_2e08,0xc,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x90));
      ParamDict::set(&local_2e08,3,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x94));
      ParamDict::set(&local_2e08,0xd,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x98));
      ParamDict::set(&local_2e08,4,0);
      ParamDict::set(&local_2e08,0xe,0);
      ParamDict::set(&local_2e08,5,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb0));
      ParamDict::set(&local_2e08,6,local_242c * local_2438 * local_243c);
      ParamDict::set(&local_2e08,8,*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc));
      (*local_2508->_vptr_Layer[2])(local_2508,&local_2e08);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xb0) == 0) {
        local_31a0 = local_3058;
        do {
          Mat::Mat(local_31a0);
          local_31a0 = local_31a0 + 1;
        } while (local_31a0 != local_2f98);
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffce0c,in_stack_ffffffffffffce08),
                       (Mat *)CONCAT44(in_stack_ffffffffffffce04,in_stack_ffffffffffffce00));
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) != 0) {
          Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffce0c,in_stack_ffffffffffffce08),
                     in_stack_ffffffffffffce04,in_stack_ffffffffffffce00);
          Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffce0c,in_stack_ffffffffffffce08),
                         (Mat *)CONCAT44(in_stack_ffffffffffffce04,in_stack_ffffffffffffce00));
          Mat::~Mat((Mat *)0x1a3412);
          Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffce0c,in_stack_ffffffffffffce08),
                     in_stack_ffffffffffffce04,in_stack_ffffffffffffce00);
          Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffce0c,in_stack_ffffffffffffce08),
                         (Mat *)CONCAT44(in_stack_ffffffffffffce04,in_stack_ffffffffffffce00));
          Mat::~Mat((Mat *)0x1a3468);
        }
        pLVar3 = local_2508;
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)
                   CONCAT44(in_stack_ffffffffffffce04,in_stack_ffffffffffffce00),
                   (Mat *)in_stack_ffffffffffffcdf8);
        (*pLVar3->_vptr_Layer[3])(pLVar3,local_30e8);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x1a356d);
        pMVar7 = local_3058;
        local_31d8 = local_2f98;
        do {
          local_31d8 = local_31d8 + -1;
          Mat::~Mat((Mat *)0x1a3598);
        } while (local_31d8 != pMVar7);
      }
      else {
        local_3138 = local_2f08;
        do {
          Mat::Mat(local_3138);
          local_3138 = local_3138 + 1;
        } while (local_3138 != (Mat *)&local_2e08);
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffce0c,in_stack_ffffffffffffce08),
                       (Mat *)CONCAT44(in_stack_ffffffffffffce04,in_stack_ffffffffffffce00));
        Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffce0c,in_stack_ffffffffffffce08),
                       (Mat *)CONCAT44(in_stack_ffffffffffffce04,in_stack_ffffffffffffce00));
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xbc) != 0) {
          Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffce0c,in_stack_ffffffffffffce08),
                     in_stack_ffffffffffffce04,in_stack_ffffffffffffce00);
          Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffce0c,in_stack_ffffffffffffce08),
                         (Mat *)CONCAT44(in_stack_ffffffffffffce04,in_stack_ffffffffffffce00));
          Mat::~Mat((Mat *)0x1a30e5);
          Mat::range((Mat *)CONCAT44(in_stack_ffffffffffffce0c,in_stack_ffffffffffffce08),
                     in_stack_ffffffffffffce04,in_stack_ffffffffffffce00);
          Mat::operator=((Mat *)CONCAT44(in_stack_ffffffffffffce0c,in_stack_ffffffffffffce08),
                         (Mat *)CONCAT44(in_stack_ffffffffffffce04,in_stack_ffffffffffffce00));
          Mat::~Mat((Mat *)0x1a313b);
        }
        pLVar3 = local_2508;
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)
                   CONCAT44(in_stack_ffffffffffffce04,in_stack_ffffffffffffce00),
                   (Mat *)in_stack_ffffffffffffcdf8);
        (*pLVar3->_vptr_Layer[3])(pLVar3,local_2f98);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x1a3277);
        local_3170 = (Mat *)&local_2e08;
        do {
          local_3170 = local_3170 + -1;
          Mat::~Mat((Mat *)0x1a32ae);
        } while (local_3170 != local_2f08);
      }
      (*local_2508->_vptr_Layer[4])(local_2508,local_18);
      in_stack_ffffffffffffcdf8 = local_2508;
      ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 2),
                           (long)local_2440);
      *ppLVar6 = in_stack_ffffffffffffcdf8;
      ParamDict::~ParamDict(in_stack_ffffffffffffce10);
      Mat::~Mat((Mat *)0x1a3674);
      Mat::~Mat((Mat *)0x1a3681);
    }
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    if (activation_type == 1)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }
    else if (activation_type == 2)
    {
        activation = ncnn::create_layer(ncnn::LayerType::ReLU);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// slope
        activation->load_param(pd);
    }
    else if (activation_type == 3)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Clip);

        ncnn::ParamDict pd;
        pd.set(0, activation_params[0]);// min
        pd.set(1, activation_params[1]);// max
        activation->load_param(pd);
    }
    else if (activation_type == 4)
    {
        activation = ncnn::create_layer(ncnn::LayerType::Sigmoid);

        ncnn::ParamDict pd;
        activation->load_param(pd);
    }

    if (activation)
    {
        activation->create_pipeline(opt);
    }

    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i=0; i<(int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();      

    if (channels == group && group == num_output)
    {
        // depth-wise specific
        if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1)
        {
            if ((stride_w == 1 && stride_h == 1) || (stride_w == 2 && stride_h == 2))
            {
                return 0;
            }
        }
    }    

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);     

    for (int g=0; g<group; g++)
    {  
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g);// num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);// pad_w
        pd.set(14, 0);// pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g);// weight_data_size
        pd.set(8, int8_scale_term);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

            if (int8_scale_term)
            {
                weights[2] = weight_data_int8_scales.range(g, 1);
                weights[3] = bottom_blob_int8_scales.range(g, 1);     
            }

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[3];
            weights[0] = weight_data_g;

            if (int8_scale_term)
            {
                weights[1] = weight_data_int8_scales.range(g, 1);
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }      

    return 0;
}